

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O2

void test_2(void)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChStreamOutAscii *pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyz> sVar8;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::fea::ChElementTetraCorot_4> melement1;
  undefined1 local_568 [16];
  double local_558;
  __shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> local_548 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_538 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_528 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_520;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_518 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_510;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_508 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_4f8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_4d8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_4c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_4b8;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_4a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_498 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_480;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_478;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_448;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_438 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_428 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_418 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_408 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3e8 [16];
  undefined8 local_3d8;
  ChSystemSMC sys;
  
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar4,"\n-------------------------------------------------\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"TEST: LINEAR tetrahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC(&sys,true);
  std::make_shared<chrono::fea::ChMesh>();
  std::make_shared<chrono::fea::ChContinuumElastic>();
  chrono::fea::ChContinuumElastic::Set_E(10000000.0);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  local_558 = 0.0;
  local_568 = ZEXT816(0);
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode1);
  local_568 = ZEXT816(0);
  local_558 = 1.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode2);
  local_568 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  local_558 = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode3);
  local_568 = ZEXT816(0x3ff0000000000000);
  local_558 = 0.0;
  sVar8 = std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>
                    ((ChVector<double> *)&mnode4);
  local_3e8 = vmovhps_avx(ZEXT816(0) << 0x40,0x40c3880000000000);
  local_3d8 = 0;
  (**(code **)(*(long *)mnode3.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))
            (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,local_3e8,
             sVar8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  peVar1 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_408,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar1,local_408);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400);
  peVar1 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_418,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar1,local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410);
  peVar1 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_428,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar1,local_428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420);
  peVar1 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_438,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar1,local_438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430);
  chrono_types::make_shared<chrono::fea::ChElementTetraCorot_4,_0>();
  peVar3 = melement1.
           super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_448,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_458,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_468,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_478,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar3 + 0x38))(peVar3,&local_448,&local_458,&local_468,&local_478);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_478._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_458._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_448._M_refcount);
  std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3f8,
             &mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
             (melement1.
              super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 0xb8),&local_3f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f8._M_refcount);
  std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChElementTetraCorot_4,void>
            (local_488,
             &melement1.
              super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddElement
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_488);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChMesh,void>
            (local_498,&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
  ;
  chrono::ChSystem::Add(&sys,local_498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_490);
  chrono_types::make_shared<chrono::ChBody,_0>();
  chrono::ChBody::SetBodyFixed
            ((bool)truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_4a8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_4a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  peVar2 = constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4b8,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_4c8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar2 + 0x220))(peVar2,&local_4b8,local_4c8,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b8._M_refcount);
  peVar2 = constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4d8,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_4e8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar2 + 0x220))(peVar2,&local_4d8,local_4e8,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d8._M_refcount);
  peVar2 = constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4f8,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_508,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar2 + 0x220))(peVar2,&local_4f8,local_508,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f8._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_518,
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_518);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_510);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_528,
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_528);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_520);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_538,
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_538);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_530);
  std::make_shared<chrono::ChSolverMINRES>();
  std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChSolverMINRES,void>
            (local_548,
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::SetSolver(&sys,local_548);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_540);
  *(undefined4 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xc) =
       100;
  *(undefined8 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) =
       0x3ddb7cdfd9d7bdbb;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8] =
       (element_type)0x1;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] =
       (element_type)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"Resulting node positions:\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode1.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode2.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode3.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode4.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"Resulting constraint reactions:\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  auVar5._0_8_ = *(ulong *)(constraint1.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 0x88) ^ 0x8000000000000000;
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_568._0_8_ =
       (ulong)*(double *)
               (constraint1.
                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + 0x78) ^ 0x8000000000000000;
  local_568._8_4_ =
       *(undefined4 *)
        (constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr + 0x80);
  local_568._12_4_ =
       *(uint *)(constraint1.
                 super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 0x84) ^ 0x80000000;
  local_558 = (double)vmovlps_avx(auVar5);
  chrono::operator<<(pCVar4,(ChVector<double> *)local_568);
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  auVar6._0_8_ = *(ulong *)(constraint2.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 0x88) ^ 0x8000000000000000;
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  local_568._0_8_ =
       (ulong)*(double *)
               (constraint2.
                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + 0x78) ^ 0x8000000000000000;
  local_568._8_4_ =
       *(undefined4 *)
        (constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr + 0x80);
  local_568._12_4_ =
       *(uint *)(constraint2.
                 super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 0x84) ^ 0x80000000;
  local_558 = (double)vmovlps_avx(auVar6);
  chrono::operator<<(pCVar4,(ChVector<double> *)local_568);
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  auVar7._0_8_ = *(ulong *)(constraint3.
                            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 0x88) ^ 0x8000000000000000;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  local_568._0_8_ =
       (ulong)*(double *)
               (constraint3.
                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + 0x78) ^ 0x8000000000000000;
  local_568._8_4_ =
       *(undefined4 *)
        (constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr + 0x80);
  local_568._12_4_ =
       *(uint *)(constraint3.
                 super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 0x84) ^ 0x80000000;
  local_558 = (double)vmovlps_avx(auVar7);
  chrono::operator<<(pCVar4,(ChVector<double> *)local_568);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&melement1.
              super___shared_ptr<chrono::fea::ChElementTetraCorot_4,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystemSMC::~ChSystemSMC(&sys);
  return;
}

Assistant:

void test_2() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: LINEAR tetrahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(0.01e9);  // rubber 0.01e9, steel 200e9
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 1));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 1, 0));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(1, 0, 0));

    // For example, set an applied force to a node:
    mnode3->SetForce(ChVector<>(0, 10000, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);

    // Create the tetrahedron element, and assign
    // nodes and material
    auto melement1 = chrono_types::make_shared<ChElementTetraCorot_4>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4);
    melement1->SetMaterial(mmaterial);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    truss->SetBodyFixed(true);
    sys.Add(truss);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,  // node 
                            truss);   // body to be connected to

    constraint3->Initialize(mnode4,  // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-10);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    GetLog() << "Resulting node positions:\n";
    GetLog() << mnode1->pos << "\n";
    GetLog() << mnode2->pos << "\n";
    GetLog() << mnode3->pos << "\n";
    GetLog() << mnode4->pos << "\n";

    GetLog() << "Resulting constraint reactions:\n";
    GetLog() << constraint1->GetReactionOnBody();
    GetLog() << constraint2->GetReactionOnBody();
    GetLog() << constraint3->GetReactionOnBody();
}